

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynhds.c
# Opt level: O3

nghttp2_nv * Curl_dynhds_to_nva(dynhds *dynhds,size_t *pcount)

{
  size_t sVar1;
  dynhds_entry **ppdVar2;
  dynhds_entry *pdVar3;
  uint8_t *puVar4;
  size_t sVar5;
  nghttp2_nv *pnVar6;
  uint8_t *puVar7;
  size_t sVar8;
  
  pnVar6 = (nghttp2_nv *)(*Curl_ccalloc)(1,dynhds->hds_len * 0x28);
  *pcount = 0;
  if (pnVar6 != (nghttp2_nv *)0x0) {
    sVar1 = dynhds->hds_len;
    if (sVar1 != 0) {
      ppdVar2 = dynhds->hds;
      puVar7 = &pnVar6->flags;
      sVar8 = 0;
      do {
        pdVar3 = ppdVar2[sVar8];
        puVar4 = (uint8_t *)pdVar3->value;
        ((nghttp2_nv *)(puVar7 + -0x20))->name = (uint8_t *)pdVar3->name;
        *(uint8_t **)(puVar7 + -0x18) = puVar4;
        sVar5 = pdVar3->valuelen;
        *(size_t *)(puVar7 + -0x10) = pdVar3->namelen;
        *(size_t *)(puVar7 + -8) = sVar5;
        *puVar7 = '\0';
        sVar8 = sVar8 + 1;
        puVar7 = puVar7 + 0x28;
      } while (sVar1 != sVar8);
    }
    *pcount = sVar1;
  }
  return pnVar6;
}

Assistant:

nghttp2_nv *Curl_dynhds_to_nva(struct dynhds *dynhds, size_t *pcount)
{
  nghttp2_nv *nva = calloc(1, sizeof(nghttp2_nv) * dynhds->hds_len);
  size_t i;

  *pcount = 0;
  if(!nva)
    return NULL;

  for(i = 0; i < dynhds->hds_len; ++i) {
    struct dynhds_entry *e = dynhds->hds[i];
    DEBUGASSERT(e);
    nva[i].name = (unsigned char *)e->name;
    nva[i].namelen = e->namelen;
    nva[i].value = (unsigned char *)e->value;
    nva[i].valuelen = e->valuelen;
    nva[i].flags = NGHTTP2_NV_FLAG_NONE;
  }
  *pcount = dynhds->hds_len;
  return nva;
}